

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  undefined4 uVar10;
  undefined1 (*pauVar11) [16];
  int *piVar12;
  ulong uVar13;
  RTCRayQueryContext *pRVar14;
  ulong uVar15;
  uint uVar16;
  Scene *pSVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  float fVar30;
  float fVar38;
  float fVar39;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar41;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar53;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar70;
  float fVar71;
  undefined1 auVar67 [16];
  float fVar73;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar74;
  undefined1 auVar69 [16];
  float fVar89;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  float fVar94;
  float fVar95;
  float fVar104;
  undefined1 auVar96 [16];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar100;
  float fVar102;
  undefined1 auVar99 [64];
  float fVar106;
  undefined1 auVar107 [16];
  float fVar114;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar111 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [64];
  undefined1 auVar123 [64];
  float fVar124;
  undefined1 auVar125 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar136;
  float fVar143;
  undefined1 auVar137 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar148 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1259;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  RayQueryContext *local_1230;
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  RayHit *local_1200;
  long local_11f8;
  int local_11ec;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  RTCFilterFunctionNArguments local_11a0;
  long local_1170;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar11 = (undefined1 (*) [16])local_f68;
    auVar88 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar87._8_4_ = 0x7fffffff;
    auVar87._0_8_ = 0x7fffffff7fffffff;
    auVar87._12_4_ = 0x7fffffff;
    auVar87 = vandps_avx((undefined1  [16])aVar1,auVar87);
    auVar75._8_4_ = 0x219392ef;
    auVar75._0_8_ = 0x219392ef219392ef;
    auVar75._12_4_ = 0x219392ef;
    auVar87 = vcmpps_avx(auVar87,auVar75,1);
    auVar76._8_4_ = 0x3f800000;
    auVar76._0_8_ = 0x3f8000003f800000;
    auVar76._12_4_ = 0x3f800000;
    auVar75 = vdivps_avx(auVar76,(undefined1  [16])aVar1);
    auVar77._8_4_ = 0x5d5e0b6b;
    auVar77._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar77._12_4_ = 0x5d5e0b6b;
    auVar87 = vblendvps_avx(auVar75,auVar77,auVar87);
    uStack_f70 = 0;
    auVar67._0_4_ = auVar87._0_4_ * 0.99999964;
    auVar67._4_4_ = auVar87._4_4_ * 0.99999964;
    auVar67._8_4_ = auVar87._8_4_ * 0.99999964;
    auVar67._12_4_ = auVar87._12_4_ * 0.99999964;
    auVar54._0_4_ = auVar87._0_4_ * 1.0000004;
    auVar54._4_4_ = auVar87._4_4_ * 1.0000004;
    auVar54._8_4_ = auVar87._8_4_ * 1.0000004;
    auVar54._12_4_ = auVar87._12_4_ * 1.0000004;
    uVar10 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fe8._4_4_ = uVar10;
    local_fe8._0_4_ = uVar10;
    local_fe8._8_4_ = uVar10;
    local_fe8._12_4_ = uVar10;
    auVar99 = ZEXT1664(local_fe8);
    uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_ff8._4_4_ = uVar10;
    local_ff8._0_4_ = uVar10;
    local_ff8._8_4_ = uVar10;
    local_ff8._12_4_ = uVar10;
    auVar111 = ZEXT1664(local_ff8);
    uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1008._4_4_ = uVar10;
    local_1008._0_4_ = uVar10;
    local_1008._8_4_ = uVar10;
    local_1008._12_4_ = uVar10;
    auVar117 = ZEXT1664(local_1008);
    local_1018 = vshufps_avx(auVar67,auVar67,0);
    auVar119 = ZEXT1664(local_1018);
    auVar87 = vmovshdup_avx(auVar67);
    local_1028 = vshufps_avx(auVar67,auVar67,0x55);
    auVar123 = ZEXT1664(local_1028);
    auVar75 = vshufpd_avx(auVar67,auVar67,1);
    local_1038 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar126 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar54,auVar54,0);
    auVar131 = ZEXT1664(local_1048);
    uVar19 = (ulong)(auVar67._0_4_ < 0.0) * 0x10;
    local_1058 = vshufps_avx(auVar54,auVar54,0x55);
    auVar138 = ZEXT1664(local_1058);
    local_1068 = vshufps_avx(auVar54,auVar54,0xaa);
    auVar148 = ZEXT1664(local_1068);
    uVar20 = (ulong)(auVar87._0_4_ < 0.0) << 4 | 0x20;
    uVar21 = (ulong)(auVar75._0_4_ < 0.0) << 4 | 0x40;
    local_1138 = vshufps_avx(auVar88,auVar88,0);
    auVar93 = ZEXT1664(local_1138);
    auVar87 = vshufps_avx(auVar42,auVar42,0);
    auVar28 = ZEXT1664(auVar87);
    local_1128 = mm_lookupmask_ps._240_8_;
    uStack_1120 = mm_lookupmask_ps._248_8_;
    local_1200 = ray;
    local_1230 = context;
LAB_011d651e:
    do {
      pauVar9 = pauVar11 + -1;
      pauVar11 = pauVar11 + -1;
      if (*(float *)(*pauVar9 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar15 = *(ulong *)*pauVar11;
        while ((uVar15 & 8) == 0) {
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar19),auVar99._0_16_);
          auVar88._0_4_ = auVar119._0_4_ * auVar87._0_4_;
          auVar88._4_4_ = auVar119._4_4_ * auVar87._4_4_;
          auVar88._8_4_ = auVar119._8_4_ * auVar87._8_4_;
          auVar88._12_4_ = auVar119._12_4_ * auVar87._12_4_;
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar20),auVar111._0_16_);
          auVar42._0_4_ = auVar123._0_4_ * auVar87._0_4_;
          auVar42._4_4_ = auVar123._4_4_ * auVar87._4_4_;
          auVar42._8_4_ = auVar123._8_4_ * auVar87._8_4_;
          auVar42._12_4_ = auVar123._12_4_ * auVar87._12_4_;
          auVar87 = vmaxps_avx(auVar88,auVar42);
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + uVar21),auVar117._0_16_);
          auVar43._0_4_ = auVar126._0_4_ * auVar75._0_4_;
          auVar43._4_4_ = auVar126._4_4_ * auVar75._4_4_;
          auVar43._8_4_ = auVar126._8_4_ * auVar75._8_4_;
          auVar43._12_4_ = auVar126._12_4_ * auVar75._12_4_;
          auVar75 = vmaxps_avx(auVar43,auVar93._0_16_);
          local_1118 = vmaxps_avx(auVar87,auVar75);
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar19 ^ 0x10)),
                               auVar99._0_16_);
          auVar44._0_4_ = auVar131._0_4_ * auVar87._0_4_;
          auVar44._4_4_ = auVar131._4_4_ * auVar87._4_4_;
          auVar44._8_4_ = auVar131._8_4_ * auVar87._8_4_;
          auVar44._12_4_ = auVar131._12_4_ * auVar87._12_4_;
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar20 ^ 0x10)),
                               auVar111._0_16_);
          auVar55._0_4_ = auVar138._0_4_ * auVar87._0_4_;
          auVar55._4_4_ = auVar138._4_4_ * auVar87._4_4_;
          auVar55._8_4_ = auVar138._8_4_ * auVar87._8_4_;
          auVar55._12_4_ = auVar138._12_4_ * auVar87._12_4_;
          auVar87 = vminps_avx(auVar44,auVar55);
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + (uVar21 ^ 0x10)),
                               auVar117._0_16_);
          auVar56._0_4_ = auVar148._0_4_ * auVar75._0_4_;
          auVar56._4_4_ = auVar148._4_4_ * auVar75._4_4_;
          auVar56._8_4_ = auVar148._8_4_ * auVar75._8_4_;
          auVar56._12_4_ = auVar148._12_4_ * auVar75._12_4_;
          auVar75 = vminps_avx(auVar56,auVar28._0_16_);
          auVar87 = vminps_avx(auVar87,auVar75);
          auVar87 = vcmpps_avx(local_1118,auVar87,2);
          uVar16 = vmovmskps_avx(auVar87);
          if (uVar16 == 0) {
            if (pauVar11 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011d651e;
          }
          uVar16 = uVar16 & 0xff;
          uVar13 = uVar15 & 0xfffffffffffffff0;
          lVar18 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar13 + lVar18 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 != 0) {
            uVar3 = *(uint *)(local_1118 + lVar18 * 4);
            lVar18 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar4 = *(ulong *)(uVar13 + lVar18 * 8);
            uVar2 = *(uint *)(local_1118 + lVar18 * 4);
            uVar16 = uVar16 - 1 & uVar16;
            if (uVar16 == 0) {
              if (uVar3 < uVar2) {
                *(ulong *)*pauVar11 = uVar4;
                *(uint *)(*pauVar11 + 8) = uVar2;
                pauVar11 = pauVar11 + 1;
              }
              else {
                *(ulong *)*pauVar11 = uVar15;
                *(uint *)(*pauVar11 + 8) = uVar3;
                pauVar11 = pauVar11 + 1;
                uVar15 = uVar4;
              }
            }
            else {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar15;
              auVar87 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar3));
              auVar45._8_8_ = 0;
              auVar45._0_8_ = uVar4;
              auVar75 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar2));
              lVar18 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *(ulong *)(uVar13 + lVar18 * 8);
              auVar42 = vpunpcklqdq_avx(auVar57,ZEXT416(*(uint *)(local_1118 + lVar18 * 4)));
              auVar88 = vpcmpgtd_avx(auVar75,auVar87);
              uVar16 = uVar16 - 1 & uVar16;
              if (uVar16 == 0) {
                auVar54 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar75,auVar87,auVar54);
                auVar87 = vblendvps_avx(auVar87,auVar75,auVar54);
                auVar75 = vpcmpgtd_avx(auVar42,auVar88);
                auVar54 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar42,auVar88,auVar54);
                auVar88 = vblendvps_avx(auVar88,auVar42,auVar54);
                auVar42 = vpcmpgtd_avx(auVar88,auVar87);
                auVar54 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar88,auVar87,auVar54);
                auVar87 = vblendvps_avx(auVar87,auVar88,auVar54);
                *pauVar11 = auVar87;
                pauVar11[1] = auVar42;
                uVar15 = auVar75._0_8_;
                pauVar11 = pauVar11 + 2;
              }
              else {
                lVar18 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                  }
                }
                auVar78._8_8_ = 0;
                auVar78._0_8_ = *(ulong *)(uVar13 + lVar18 * 8);
                auVar67 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_1118 + lVar18 * 4)));
                auVar54 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar75,auVar87,auVar54);
                auVar87 = vblendvps_avx(auVar87,auVar75,auVar54);
                auVar75 = vpcmpgtd_avx(auVar67,auVar42);
                auVar54 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar67,auVar42,auVar54);
                auVar42 = vblendvps_avx(auVar42,auVar67,auVar54);
                auVar54 = vpcmpgtd_avx(auVar42,auVar87);
                auVar67 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar42,auVar87,auVar67);
                auVar87 = vblendvps_avx(auVar87,auVar42,auVar67);
                auVar42 = vpcmpgtd_avx(auVar75,auVar88);
                auVar67 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar75,auVar88,auVar67);
                auVar75 = vblendvps_avx(auVar88,auVar75,auVar67);
                auVar88 = vpcmpgtd_avx(auVar54,auVar75);
                auVar67 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar54,auVar75,auVar67);
                auVar75 = vblendvps_avx(auVar75,auVar54,auVar67);
                *pauVar11 = auVar87;
                pauVar11[1] = auVar75;
                pauVar11[2] = auVar88;
                auVar93 = ZEXT1664(local_1138);
                uVar15 = auVar42._0_8_;
                pauVar11 = pauVar11 + 3;
              }
            }
          }
        }
        local_1170 = (ulong)((uint)uVar15 & 0xf) - 8;
        if (local_1170 != 0) {
          uVar15 = uVar15 & 0xfffffffffffffff0;
          local_11f8 = 0;
          do {
            lVar18 = local_11f8 * 0xb0;
            uVar10 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar32._4_4_ = uVar10;
            auVar32._0_4_ = uVar10;
            auVar32._8_4_ = uVar10;
            auVar32._12_4_ = uVar10;
            uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar46._4_4_ = uVar10;
            auVar46._0_4_ = uVar10;
            auVar46._8_4_ = uVar10;
            auVar46._12_4_ = uVar10;
            uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar58._4_4_ = uVar10;
            auVar58._0_4_ = uVar10;
            auVar58._8_4_ = uVar10;
            auVar58._12_4_ = uVar10;
            local_11d8 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + lVar18),auVar32);
            local_11b8 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x10 + lVar18),auVar46);
            local_11e8 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x20 + lVar18),auVar58);
            auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x30 + lVar18),auVar32);
            auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x40 + lVar18),auVar46);
            auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x50 + lVar18),auVar58);
            auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x60 + lVar18),auVar32);
            auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x70 + lVar18),auVar46);
            auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar15 + 0x80 + lVar18),auVar58);
            local_f88 = vsubps_avx(auVar42,local_11d8);
            local_f98 = vsubps_avx(auVar54,local_11b8);
            local_fa8 = vsubps_avx(auVar67,local_11e8);
            fVar135 = local_11b8._0_4_;
            fVar29 = fVar135 + auVar54._0_4_;
            fVar139 = local_11b8._4_4_;
            fVar38 = fVar139 + auVar54._4_4_;
            fVar141 = local_11b8._8_4_;
            fVar39 = fVar141 + auVar54._8_4_;
            fVar143 = local_11b8._12_4_;
            fVar41 = fVar143 + auVar54._12_4_;
            fVar118 = local_11e8._0_4_;
            fVar66 = fVar118 + auVar67._0_4_;
            fVar120 = local_11e8._4_4_;
            fVar70 = fVar120 + auVar67._4_4_;
            fVar121 = local_11e8._8_4_;
            fVar71 = fVar121 + auVar67._8_4_;
            fVar122 = local_11e8._12_4_;
            fVar73 = fVar122 + auVar67._12_4_;
            fVar30 = local_fa8._0_4_;
            auVar107._0_4_ = fVar29 * fVar30;
            fVar40 = local_fa8._4_4_;
            auVar107._4_4_ = fVar38 * fVar40;
            fVar89 = local_fa8._8_4_;
            auVar107._8_4_ = fVar39 * fVar89;
            fVar6 = local_fa8._12_4_;
            auVar107._12_4_ = fVar41 * fVar6;
            fVar145 = local_f98._0_4_;
            auVar115._0_4_ = fVar145 * fVar66;
            fVar149 = local_f98._4_4_;
            auVar115._4_4_ = fVar149 * fVar70;
            fVar152 = local_f98._8_4_;
            auVar115._8_4_ = fVar152 * fVar71;
            fVar155 = local_f98._12_4_;
            auVar115._12_4_ = fVar155 * fVar73;
            auVar76 = vsubps_avx(auVar115,auVar107);
            fVar94 = local_11d8._0_4_;
            fVar106 = fVar94 + auVar42._0_4_;
            fVar100 = local_11d8._4_4_;
            fVar112 = fVar100 + auVar42._4_4_;
            fVar102 = local_11d8._8_4_;
            fVar113 = fVar102 + auVar42._8_4_;
            fVar104 = local_11d8._12_4_;
            fVar114 = fVar104 + auVar42._12_4_;
            fVar130 = local_f88._0_4_;
            auVar68._0_4_ = fVar130 * fVar66;
            fVar132 = local_f88._4_4_;
            auVar68._4_4_ = fVar132 * fVar70;
            fVar133 = local_f88._8_4_;
            auVar68._8_4_ = fVar133 * fVar71;
            fVar134 = local_f88._12_4_;
            auVar68._12_4_ = fVar134 * fVar73;
            auVar116._0_4_ = fVar106 * fVar30;
            auVar116._4_4_ = fVar112 * fVar40;
            auVar116._8_4_ = fVar113 * fVar89;
            auVar116._12_4_ = fVar114 * fVar6;
            auVar77 = vsubps_avx(auVar116,auVar68);
            auVar108._0_4_ = fVar106 * fVar145;
            auVar108._4_4_ = fVar112 * fVar149;
            auVar108._8_4_ = fVar113 * fVar152;
            auVar108._12_4_ = fVar114 * fVar155;
            auVar33._0_4_ = fVar130 * fVar29;
            auVar33._4_4_ = fVar132 * fVar38;
            auVar33._8_4_ = fVar133 * fVar39;
            auVar33._12_4_ = fVar134 * fVar41;
            auVar43 = vsubps_avx(auVar33,auVar108);
            fVar29 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar38 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1248._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1258._0_4_ =
                 local_1248._4_4_ * auVar76._0_4_ + fVar29 * auVar43._0_4_ + fVar38 * auVar77._0_4_;
            local_1258._4_4_ =
                 local_1248._4_4_ * auVar76._4_4_ + fVar29 * auVar43._4_4_ + fVar38 * auVar77._4_4_;
            local_1258._8_4_ =
                 local_1248._4_4_ * auVar76._8_4_ + fVar29 * auVar43._8_4_ + fVar38 * auVar77._8_4_;
            local_1258._12_4_ =
                 local_1248._4_4_ * auVar76._12_4_ +
                 fVar29 * auVar43._12_4_ + fVar38 * auVar77._12_4_;
            local_fb8 = vsubps_avx(local_11b8,auVar75);
            local_fc8 = vsubps_avx(local_11e8,auVar88);
            fVar71 = fVar135 + auVar75._0_4_;
            fVar73 = fVar139 + auVar75._4_4_;
            fVar106 = fVar141 + auVar75._8_4_;
            fVar112 = fVar143 + auVar75._12_4_;
            fVar113 = fVar118 + auVar88._0_4_;
            fVar114 = fVar120 + auVar88._4_4_;
            fVar72 = fVar121 + auVar88._8_4_;
            fVar74 = fVar122 + auVar88._12_4_;
            fVar39 = local_fc8._0_4_;
            auVar125._0_4_ = fVar71 * fVar39;
            fVar41 = local_fc8._4_4_;
            auVar125._4_4_ = fVar73 * fVar41;
            fVar66 = local_fc8._8_4_;
            auVar125._8_4_ = fVar106 * fVar66;
            fVar70 = local_fc8._12_4_;
            auVar125._12_4_ = fVar112 * fVar70;
            fVar146 = local_fb8._0_4_;
            auVar137._0_4_ = fVar146 * fVar113;
            fVar150 = local_fb8._4_4_;
            auVar137._4_4_ = fVar150 * fVar114;
            fVar153 = local_fb8._8_4_;
            auVar137._8_4_ = fVar153 * fVar72;
            fVar156 = local_fb8._12_4_;
            auVar137._12_4_ = fVar156 * fVar74;
            auVar76 = vsubps_avx(auVar137,auVar125);
            auVar77 = vsubps_avx(local_11d8,auVar87);
            fVar136 = auVar77._0_4_;
            auVar69._0_4_ = fVar136 * fVar113;
            fVar140 = auVar77._4_4_;
            auVar69._4_4_ = fVar140 * fVar114;
            fVar142 = auVar77._8_4_;
            auVar69._8_4_ = fVar142 * fVar72;
            fVar144 = auVar77._12_4_;
            auVar69._12_4_ = fVar144 * fVar74;
            fVar113 = fVar94 + auVar87._0_4_;
            fVar114 = fVar100 + auVar87._4_4_;
            fVar72 = fVar102 + auVar87._8_4_;
            fVar74 = fVar104 + auVar87._12_4_;
            auVar109._0_4_ = fVar113 * fVar39;
            auVar109._4_4_ = fVar114 * fVar41;
            auVar109._8_4_ = fVar72 * fVar66;
            auVar109._12_4_ = fVar74 * fVar70;
            auVar77 = vsubps_avx(auVar109,auVar69);
            auVar96._0_4_ = fVar146 * fVar113;
            auVar96._4_4_ = fVar150 * fVar114;
            auVar96._8_4_ = fVar153 * fVar72;
            auVar96._12_4_ = fVar156 * fVar74;
            auVar34._0_4_ = fVar136 * fVar71;
            auVar34._4_4_ = fVar140 * fVar73;
            auVar34._8_4_ = fVar142 * fVar106;
            auVar34._12_4_ = fVar144 * fVar112;
            auVar43 = vsubps_avx(auVar34,auVar96);
            local_1108._0_4_ =
                 local_1248._4_4_ * auVar76._0_4_ + fVar29 * auVar43._0_4_ + fVar38 * auVar77._0_4_;
            local_1108._4_4_ =
                 local_1248._4_4_ * auVar76._4_4_ + fVar29 * auVar43._4_4_ + fVar38 * auVar77._4_4_;
            local_1108._8_4_ =
                 local_1248._4_4_ * auVar76._8_4_ + fVar29 * auVar43._8_4_ + fVar38 * auVar77._8_4_;
            local_1108._12_4_ =
                 local_1248._4_4_ * auVar76._12_4_ +
                 fVar29 * auVar43._12_4_ + fVar38 * auVar77._12_4_;
            auVar76 = vsubps_avx(auVar87,auVar42);
            fVar95 = auVar87._0_4_ + auVar42._0_4_;
            fVar101 = auVar87._4_4_ + auVar42._4_4_;
            fVar103 = auVar87._8_4_ + auVar42._8_4_;
            fVar105 = auVar87._12_4_ + auVar42._12_4_;
            auVar87 = vsubps_avx(auVar75,auVar54);
            fVar71 = auVar75._0_4_ + auVar54._0_4_;
            fVar73 = auVar75._4_4_ + auVar54._4_4_;
            fVar106 = auVar75._8_4_ + auVar54._8_4_;
            fVar112 = auVar75._12_4_ + auVar54._12_4_;
            auVar75 = vsubps_avx(auVar88,auVar67);
            fVar114 = auVar88._0_4_ + auVar67._0_4_;
            fVar72 = auVar88._4_4_ + auVar67._4_4_;
            fVar74 = auVar88._8_4_ + auVar67._8_4_;
            fVar53 = auVar88._12_4_ + auVar67._12_4_;
            fVar147 = auVar75._0_4_;
            auVar59._0_4_ = fVar147 * fVar71;
            fVar151 = auVar75._4_4_;
            auVar59._4_4_ = fVar151 * fVar73;
            fVar154 = auVar75._8_4_;
            auVar59._8_4_ = fVar154 * fVar106;
            fVar157 = auVar75._12_4_;
            auVar59._12_4_ = fVar157 * fVar112;
            fVar124 = auVar87._0_4_;
            auVar79._0_4_ = fVar124 * fVar114;
            fVar127 = auVar87._4_4_;
            auVar79._4_4_ = fVar127 * fVar72;
            fVar128 = auVar87._8_4_;
            auVar79._8_4_ = fVar128 * fVar74;
            fVar129 = auVar87._12_4_;
            auVar79._12_4_ = fVar129 * fVar53;
            auVar87 = vsubps_avx(auVar79,auVar59);
            fVar113 = auVar76._0_4_;
            auVar47._0_4_ = fVar113 * fVar114;
            fVar114 = auVar76._4_4_;
            auVar47._4_4_ = fVar114 * fVar72;
            fVar72 = auVar76._8_4_;
            auVar47._8_4_ = fVar72 * fVar74;
            fVar74 = auVar76._12_4_;
            auVar47._12_4_ = fVar74 * fVar53;
            auVar80._0_4_ = fVar147 * fVar95;
            auVar80._4_4_ = fVar151 * fVar101;
            auVar80._8_4_ = fVar154 * fVar103;
            auVar80._12_4_ = fVar157 * fVar105;
            auVar75 = vsubps_avx(auVar80,auVar47);
            auVar81._0_4_ = fVar124 * fVar95;
            auVar81._4_4_ = fVar127 * fVar101;
            auVar81._8_4_ = fVar128 * fVar103;
            auVar81._12_4_ = fVar129 * fVar105;
            auVar22._0_4_ = fVar113 * fVar71;
            auVar22._4_4_ = fVar114 * fVar73;
            auVar22._8_4_ = fVar72 * fVar106;
            auVar22._12_4_ = fVar74 * fVar112;
            auVar88 = vsubps_avx(auVar22,auVar81);
            local_1248._0_4_ = (uint)local_1248._4_4_;
            fStack_1240 = local_1248._4_4_;
            fStack_123c = local_1248._4_4_;
            auVar23._0_4_ =
                 local_1248._4_4_ * auVar87._0_4_ + fVar29 * auVar88._0_4_ + fVar38 * auVar75._0_4_;
            auVar23._4_4_ =
                 local_1248._4_4_ * auVar87._4_4_ + fVar29 * auVar88._4_4_ + fVar38 * auVar75._4_4_;
            auVar23._8_4_ =
                 local_1248._4_4_ * auVar87._8_4_ + fVar29 * auVar88._8_4_ + fVar38 * auVar75._8_4_;
            auVar23._12_4_ =
                 local_1248._4_4_ * auVar87._12_4_ +
                 fVar29 * auVar88._12_4_ + fVar38 * auVar75._12_4_;
            local_10f8._0_4_ = auVar23._0_4_ + local_1258._0_4_ + local_1108._0_4_;
            local_10f8._4_4_ = auVar23._4_4_ + local_1258._4_4_ + local_1108._4_4_;
            local_10f8._8_4_ = auVar23._8_4_ + local_1258._8_4_ + local_1108._8_4_;
            local_10f8._12_4_ = auVar23._12_4_ + local_1258._12_4_ + local_1108._12_4_;
            auVar87 = vminps_avx(local_1258,local_1108);
            auVar87 = vminps_avx(auVar87,auVar23);
            auVar60._8_4_ = 0x7fffffff;
            auVar60._0_8_ = 0x7fffffff7fffffff;
            auVar60._12_4_ = 0x7fffffff;
            local_1228 = vandps_avx(local_10f8,auVar60);
            auVar61._0_4_ = local_1228._0_4_ * 1.1920929e-07;
            auVar61._4_4_ = local_1228._4_4_ * 1.1920929e-07;
            auVar61._8_4_ = local_1228._8_4_ * 1.1920929e-07;
            auVar61._12_4_ = local_1228._12_4_ * 1.1920929e-07;
            uVar13 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
            auVar82._0_8_ = uVar13 ^ 0x8000000080000000;
            auVar82._8_4_ = -auVar61._8_4_;
            auVar82._12_4_ = -auVar61._12_4_;
            auVar87 = vcmpps_avx(auVar87,auVar82,5);
            auVar75 = vmaxps_avx(local_1258,local_1108);
            auVar75 = vmaxps_avx(auVar75,auVar23);
            auVar75 = vcmpps_avx(auVar75,auVar61,2);
            local_fd8 = vorps_avx(auVar87,auVar75);
            auVar7._8_8_ = uStack_1120;
            auVar7._0_8_ = local_1128;
            auVar7 = auVar7 & local_fd8;
            if ((((auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar7[0xf] < '\0') {
              auVar24._0_4_ = fVar146 * fVar30;
              auVar24._4_4_ = fVar150 * fVar40;
              auVar24._8_4_ = fVar153 * fVar89;
              auVar24._12_4_ = fVar156 * fVar6;
              auVar48._0_4_ = fVar145 * fVar39;
              auVar48._4_4_ = fVar149 * fVar41;
              auVar48._8_4_ = fVar152 * fVar66;
              auVar48._12_4_ = fVar155 * fVar70;
              auVar88 = vsubps_avx(auVar48,auVar24);
              auVar62._0_4_ = fVar124 * fVar39;
              auVar62._4_4_ = fVar127 * fVar41;
              auVar62._8_4_ = fVar128 * fVar66;
              auVar62._12_4_ = fVar129 * fVar70;
              auVar83._0_4_ = fVar146 * fVar147;
              auVar83._4_4_ = fVar150 * fVar151;
              auVar83._8_4_ = fVar153 * fVar154;
              auVar83._12_4_ = fVar156 * fVar157;
              auVar42 = vsubps_avx(auVar83,auVar62);
              auVar97._8_4_ = 0x7fffffff;
              auVar97._0_8_ = 0x7fffffff7fffffff;
              auVar97._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx(auVar24,auVar97);
              auVar75 = vandps_avx(auVar62,auVar97);
              auVar87 = vcmpps_avx(auVar87,auVar75,1);
              local_1098 = vblendvps_avx(auVar42,auVar88,auVar87);
              auVar49._0_4_ = fVar136 * fVar147;
              auVar49._4_4_ = fVar140 * fVar151;
              auVar49._8_4_ = fVar142 * fVar154;
              auVar49._12_4_ = fVar144 * fVar157;
              auVar63._0_4_ = fVar136 * fVar30;
              auVar63._4_4_ = fVar140 * fVar40;
              auVar63._8_4_ = fVar142 * fVar89;
              auVar63._12_4_ = fVar144 * fVar6;
              auVar84._0_4_ = fVar130 * fVar39;
              auVar84._4_4_ = fVar132 * fVar41;
              auVar84._8_4_ = fVar133 * fVar66;
              auVar84._12_4_ = fVar134 * fVar70;
              auVar88 = vsubps_avx(auVar63,auVar84);
              auVar90._0_4_ = fVar39 * fVar113;
              auVar90._4_4_ = fVar41 * fVar114;
              auVar90._8_4_ = fVar66 * fVar72;
              auVar90._12_4_ = fVar70 * fVar74;
              auVar42 = vsubps_avx(auVar90,auVar49);
              auVar87 = vandps_avx(auVar84,auVar97);
              auVar75 = vandps_avx(auVar49,auVar97);
              auVar87 = vcmpps_avx(auVar87,auVar75,1);
              local_1088 = vblendvps_avx(auVar42,auVar88,auVar87);
              auVar35._0_4_ = fVar146 * fVar113;
              auVar35._4_4_ = fVar150 * fVar114;
              auVar35._8_4_ = fVar153 * fVar72;
              auVar35._12_4_ = fVar156 * fVar74;
              auVar64._0_4_ = fVar146 * fVar130;
              auVar64._4_4_ = fVar150 * fVar132;
              auVar64._8_4_ = fVar153 * fVar133;
              auVar64._12_4_ = fVar156 * fVar134;
              auVar85._0_4_ = fVar136 * fVar145;
              auVar85._4_4_ = fVar140 * fVar149;
              auVar85._8_4_ = fVar142 * fVar152;
              auVar85._12_4_ = fVar144 * fVar155;
              auVar91._0_4_ = fVar136 * fVar124;
              auVar91._4_4_ = fVar140 * fVar127;
              auVar91._8_4_ = fVar142 * fVar128;
              auVar91._12_4_ = fVar144 * fVar129;
              auVar88 = vsubps_avx(auVar64,auVar85);
              auVar42 = vsubps_avx(auVar91,auVar35);
              auVar87 = vandps_avx(auVar85,auVar97);
              auVar75 = vandps_avx(auVar35,auVar97);
              auVar87 = vcmpps_avx(auVar87,auVar75,1);
              local_1078 = vblendvps_avx(auVar42,auVar88,auVar87);
              fVar30 = local_1098._0_4_ * local_1248._4_4_ +
                       fVar29 * local_1078._0_4_ + local_1088._0_4_ * fVar38;
              fVar39 = local_1098._4_4_ * local_1248._4_4_ +
                       fVar29 * local_1078._4_4_ + local_1088._4_4_ * fVar38;
              fVar40 = local_1098._8_4_ * local_1248._4_4_ +
                       fVar29 * local_1078._8_4_ + local_1088._8_4_ * fVar38;
              fVar29 = local_1098._12_4_ * local_1248._4_4_ +
                       fVar29 * local_1078._12_4_ + local_1088._12_4_ * fVar38;
              auVar36._0_4_ = fVar30 + fVar30;
              auVar36._4_4_ = fVar39 + fVar39;
              auVar36._8_4_ = fVar40 + fVar40;
              auVar36._12_4_ = fVar29 + fVar29;
              fVar40 = local_1098._0_4_ * fVar94 +
                       local_1078._0_4_ * fVar118 + local_1088._0_4_ * fVar135;
              fVar41 = local_1098._4_4_ * fVar100 +
                       local_1078._4_4_ * fVar120 + local_1088._4_4_ * fVar139;
              fVar89 = local_1098._8_4_ * fVar102 +
                       local_1078._8_4_ * fVar121 + local_1088._8_4_ * fVar141;
              fVar66 = local_1098._12_4_ * fVar104 +
                       local_1078._12_4_ * fVar122 + local_1088._12_4_ * fVar143;
              auVar87 = vrcpps_avx(auVar36);
              fVar29 = auVar87._0_4_;
              auVar98._0_4_ = auVar36._0_4_ * fVar29;
              fVar38 = auVar87._4_4_;
              auVar98._4_4_ = auVar36._4_4_ * fVar38;
              fVar30 = auVar87._8_4_;
              auVar98._8_4_ = auVar36._8_4_ * fVar30;
              fVar39 = auVar87._12_4_;
              auVar98._12_4_ = auVar36._12_4_ * fVar39;
              auVar110._8_4_ = 0x3f800000;
              auVar110._0_8_ = 0x3f8000003f800000;
              auVar110._12_4_ = 0x3f800000;
              auVar87 = vsubps_avx(auVar110,auVar98);
              local_1218._0_4_ = (fVar40 + fVar40) * (fVar29 + fVar29 * auVar87._0_4_);
              local_1218._4_4_ = (fVar41 + fVar41) * (fVar38 + fVar38 * auVar87._4_4_);
              local_1218._8_4_ = (fVar89 + fVar89) * (fVar30 + fVar30 * auVar87._8_4_);
              local_1218._12_4_ = (fVar66 + fVar66) * (fVar39 + fVar39 * auVar87._12_4_);
              uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar86._4_4_ = uVar10;
              auVar86._0_4_ = uVar10;
              auVar86._8_4_ = uVar10;
              auVar86._12_4_ = uVar10;
              auVar87 = vcmpps_avx(auVar86,local_1218,2);
              fVar29 = (ray->super_RayK<1>).tfar;
              auVar92._4_4_ = fVar29;
              auVar92._0_4_ = fVar29;
              auVar92._8_4_ = fVar29;
              auVar92._12_4_ = fVar29;
              auVar75 = vcmpps_avx(local_1218,auVar92,2);
              auVar87 = vandps_avx(auVar87,auVar75);
              auVar75 = vcmpps_avx(auVar36,_DAT_01f7aa10,4);
              auVar87 = vandps_avx(auVar75,auVar87);
              auVar8._8_8_ = uStack_1120;
              auVar8._0_8_ = local_1128;
              auVar75 = vandps_avx(local_fd8,auVar8);
              auVar87 = vpslld_avx(auVar87,0x1f);
              auVar88 = vpsrad_avx(auVar87,0x1f);
              auVar87 = auVar75 & auVar88;
              if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar87[0xf] < '\0') {
                local_11d8._0_4_ = (ray->super_RayK<1>).tfar;
                local_11d8._4_4_ = (ray->super_RayK<1>).mask;
                local_11d8._8_4_ = (ray->super_RayK<1>).id;
                local_11d8._12_4_ = (ray->super_RayK<1>).flags;
                auVar75 = vandps_avx(auVar88,auVar75);
                local_1118 = local_1258;
                local_10e8 = &local_1259;
                local_10d8 = auVar75;
                local_10a8 = local_1218;
                pSVar17 = local_1230->scene;
                local_11c8 = auVar75;
                auVar87 = vrcpps_avx(local_10f8);
                fVar29 = auVar87._0_4_;
                auVar50._0_4_ = local_10f8._0_4_ * fVar29;
                fVar38 = auVar87._4_4_;
                auVar50._4_4_ = local_10f8._4_4_ * fVar38;
                fVar30 = auVar87._8_4_;
                auVar50._8_4_ = local_10f8._8_4_ * fVar30;
                fVar39 = auVar87._12_4_;
                auVar50._12_4_ = local_10f8._12_4_ * fVar39;
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = 0x3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar87 = vsubps_avx(auVar65,auVar50);
                auVar25._0_4_ = fVar29 + fVar29 * auVar87._0_4_;
                auVar25._4_4_ = fVar38 + fVar38 * auVar87._4_4_;
                auVar25._8_4_ = fVar30 + fVar30 * auVar87._8_4_;
                auVar25._12_4_ = fVar39 + fVar39 * auVar87._12_4_;
                auVar51._8_4_ = 0x219392ef;
                auVar51._0_8_ = 0x219392ef219392ef;
                auVar51._12_4_ = 0x219392ef;
                auVar87 = vcmpps_avx(local_1228,auVar51,5);
                auVar87 = vandps_avx(auVar87,auVar25);
                auVar52._0_4_ = local_1258._0_4_ * auVar87._0_4_;
                auVar52._4_4_ = local_1258._4_4_ * auVar87._4_4_;
                auVar52._8_4_ = local_1258._8_4_ * auVar87._8_4_;
                auVar52._12_4_ = local_1258._12_4_ * auVar87._12_4_;
                local_10c8 = vminps_avx(auVar52,auVar65);
                auVar26._0_4_ = local_1108._0_4_ * auVar87._0_4_;
                auVar26._4_4_ = local_1108._4_4_ * auVar87._4_4_;
                auVar26._8_4_ = local_1108._8_4_ * auVar87._8_4_;
                auVar26._12_4_ = local_1108._12_4_ * auVar87._12_4_;
                local_10b8 = vminps_avx(auVar26,auVar65);
                auVar27._8_4_ = 0x7f800000;
                auVar27._0_8_ = 0x7f8000007f800000;
                auVar27._12_4_ = 0x7f800000;
                auVar87 = vblendvps_avx(auVar27,local_1218,auVar75);
                auVar88 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar88 = vminps_avx(auVar88,auVar87);
                auVar42 = vshufpd_avx(auVar88,auVar88,1);
                auVar88 = vminps_avx(auVar42,auVar88);
                auVar87 = vcmpps_avx(auVar87,auVar88,0);
                auVar88 = auVar75 & auVar87;
                if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar88[0xf] < '\0') {
                  auVar75 = vandps_avx(auVar87,auVar75);
                }
                lVar18 = lVar18 + uVar15;
                uVar16 = vextractps_avx(local_11d8,1);
                uVar10 = vmovmskps_avx(auVar75);
                uVar13 = CONCAT44((int)((ulong)local_1230 >> 0x20),uVar10);
                piVar12 = (int *)0x0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> (long)piVar12 & 1) == 0; piVar12 = (int *)((long)piVar12 + 1)) {
                  }
                }
                do {
                  uVar3 = *(uint *)(lVar18 + 0x90 + (long)piVar12 * 4);
                  pGVar5 = (pSVar17->geometries).items[uVar3].ptr;
                  if ((pGVar5->mask & uVar16) == 0) {
                    *(undefined4 *)(local_11c8 + (long)piVar12 * 4) = 0;
                  }
                  else {
                    local_1248 = (long)piVar12;
                    local_11b8._0_8_ = local_1230->args;
                    if (local_1230->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar14 = local_1230->user;
                      if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar29 = *(float *)(local_10c8 + (long)piVar12 * 4);
                        fVar38 = *(float *)(local_10b8 + (long)piVar12 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)piVar12 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1098 + (long)piVar12 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1088 + (long)piVar12 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_1078 + (long)piVar12 * 4);
                        ray->u = fVar29;
                        ray->v = fVar38;
                        ray->primID = *(uint *)(lVar18 + 0xa0 + (long)piVar12 * 4);
                        ray->geomID = uVar3;
                        ray->instID[0] = pRVar14->instID[0];
                        ray->instPrimID[0] = pRVar14->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar14 = local_1230->user;
                    }
                    local_1258._0_8_ = pSVar17;
                    local_1168 = *(undefined4 *)(local_1098 + (long)piVar12 * 4);
                    local_1164 = *(undefined4 *)(local_1088 + (long)piVar12 * 4);
                    local_1160 = *(undefined4 *)(local_1078 + (long)piVar12 * 4);
                    local_115c = *(undefined4 *)(local_10c8 + (long)piVar12 * 4);
                    local_1158 = *(undefined4 *)(local_10b8 + (long)piVar12 * 4);
                    local_1154 = *(undefined4 *)(lVar18 + 0xa0 + (long)piVar12 * 4);
                    local_1150 = uVar3;
                    local_114c = pRVar14->instID[0];
                    local_1148 = pRVar14->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)piVar12 * 4);
                    local_11ec = -1;
                    local_11a0.valid = &local_11ec;
                    local_11a0.geometryUserPtr = pGVar5->userPtr;
                    local_11a0.context = pRVar14;
                    local_11a0.ray = (RTCRayN *)ray;
                    local_11a0.hit = (RTCHitN *)&local_1168;
                    local_11a0.N = 1;
                    local_11e8._0_8_ = pGVar5;
                    local_1228._0_8_ = lVar18;
                    if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar5->intersectionFilterN)(&local_11a0), ray = local_1200,
                       *local_11a0.valid != 0)) {
                      if ((*(code **)(local_11b8._0_8_ + 0x10) != (code *)0x0) &&
                         ((((*(byte *)local_11b8._0_8_ & 2) != 0 ||
                           ((*(byte *)(local_11e8._0_8_ + 0x3e) & 0x40) != 0)) &&
                          ((**(code **)(local_11b8._0_8_ + 0x10))(&local_11a0), ray = local_1200,
                          *local_11a0.valid == 0)))) goto LAB_011d6ff6;
                      (((Vec3f *)((long)local_11a0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11a0.hit;
                      (((Vec3f *)((long)local_11a0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11a0.hit + 4);
                      (((Vec3f *)((long)local_11a0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11a0.hit + 8);
                      *(float *)((long)local_11a0.ray + 0x3c) = *(float *)(local_11a0.hit + 0xc);
                      *(float *)((long)local_11a0.ray + 0x40) = *(float *)(local_11a0.hit + 0x10);
                      *(float *)((long)local_11a0.ray + 0x44) = *(float *)(local_11a0.hit + 0x14);
                      *(float *)((long)local_11a0.ray + 0x48) = *(float *)(local_11a0.hit + 0x18);
                      *(float *)((long)local_11a0.ray + 0x4c) = *(float *)(local_11a0.hit + 0x1c);
                      *(float *)((long)local_11a0.ray + 0x50) = *(float *)(local_11a0.hit + 0x20);
                    }
                    else {
LAB_011d6ff6:
                      (local_1200->super_RayK<1>).tfar = (float)local_11d8._0_4_;
                      ray = local_1200;
                    }
                    *(undefined4 *)(local_11c8 + local_1248 * 4) = 0;
                    fVar29 = (ray->super_RayK<1>).tfar;
                    auVar37._4_4_ = fVar29;
                    auVar37._0_4_ = fVar29;
                    auVar37._8_4_ = fVar29;
                    auVar37._12_4_ = fVar29;
                    auVar87 = vcmpps_avx(local_1218,auVar37,2);
                    local_11c8 = vandps_avx(auVar87,local_11c8);
                    local_11d8._0_4_ = (ray->super_RayK<1>).tfar;
                    local_11d8._4_4_ = (ray->super_RayK<1>).mask;
                    local_11d8._8_4_ = (ray->super_RayK<1>).id;
                    local_11d8._12_4_ = (ray->super_RayK<1>).flags;
                    uVar16 = vextractps_avx(local_11d8,1);
                    pSVar17 = (Scene *)local_1258._0_8_;
                    lVar18 = local_1228._0_8_;
                  }
                  if ((((local_11c8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_11c8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_11c8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_11c8[0xf]) break;
                  local_1228._0_8_ = lVar18;
                  local_1258._0_8_ = pSVar17;
                  local_1248._0_4_ = uVar16;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_11a0);
                  piVar12 = local_11a0.valid;
                  pSVar17 = (Scene *)local_1258._0_8_;
                  lVar18 = local_1228._0_8_;
                  ray = local_1200;
                  uVar16 = (uint)local_1248;
                } while( true );
              }
            }
            local_11f8 = local_11f8 + 1;
          } while (local_11f8 != local_1170);
        }
        fVar29 = (ray->super_RayK<1>).tfar;
        auVar28 = ZEXT1664(CONCAT412(fVar29,CONCAT48(fVar29,CONCAT44(fVar29,fVar29))));
        auVar99 = ZEXT1664(local_fe8);
        auVar111 = ZEXT1664(local_ff8);
        auVar117 = ZEXT1664(local_1008);
        auVar119 = ZEXT1664(local_1018);
        auVar123 = ZEXT1664(local_1028);
        auVar126 = ZEXT1664(local_1038);
        auVar131 = ZEXT1664(local_1048);
        auVar138 = ZEXT1664(local_1058);
        auVar148 = ZEXT1664(local_1068);
        auVar93 = ZEXT1664(local_1138);
      }
    } while (pauVar11 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }